

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_>_>
  _Var5;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge> *pPVar6;
  char *pcVar7;
  element_type *peVar8;
  _Alloc_hider _Var9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  long *plVar13;
  long *plVar14;
  undefined8 *puVar15;
  ostream *poVar16;
  size_t sVar17;
  const_iterator cVar18;
  undefined4 extraout_var;
  undefined4 *puVar19;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer psVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pIVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  string param_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_suite_name;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  generator;
  GTestLog local_1b8;
  int local_1b4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b0;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge> *local_1a8;
  char *local_1a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  element_type *local_190;
  string local_188;
  string local_168;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  long local_118;
  char *local_110;
  undefined8 local_108;
  char local_100 [16];
  long *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  pointer local_e0;
  pointer local_d8;
  ParamNameGeneratorFunc *local_d0;
  char *local_c8;
  CodeLocation local_c0;
  string local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  CodeLocation local_58;
  
  psVar20 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1a8 = this;
  if (psVar20 !=
      (this->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar11 = false;
    do {
      local_190 = (psVar20->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      this_00 = (psVar20->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pIVar24 = (local_1a8->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_198 = this_00;
      local_e0 = psVar20;
      if (pIVar24 !=
          (local_1a8->instantiations_).
          super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::InstantiationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          (*pIVar24->generator)(&local_f0);
          local_d0 = pIVar24->name_func;
          pcVar2 = pIVar24->file;
          local_1b4 = pIVar24->line;
          local_110 = local_100;
          local_108 = 0;
          local_100[0] = '\0';
          sVar3 = (pIVar24->name)._M_string_length;
          if (sVar3 != 0) {
            local_148._M_impl._0_8_ = &local_148._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar4 = (pIVar24->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)&local_148,pcVar4,pcVar4 + sVar3);
            std::__cxx11::string::append((char *)&local_148);
            std::__cxx11::string::operator=((string *)&local_110,(string *)&local_148);
            if ((_Base_ptr *)local_148._M_impl._0_8_ !=
                &local_148._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_148._M_impl._0_8_);
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_110,(ulong)(local_190->test_suite_base_name)._M_dataplus._M_p);
          local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_148._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_148._M_impl.super__Rb_tree_header._M_header;
          local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1a0 = pcVar2;
          local_148._M_impl.super__Rb_tree_header._M_header._M_right =
               local_148._M_impl.super__Rb_tree_header._M_header._M_left;
          local_d8 = pIVar24;
          plVar13 = (long *)(**(code **)(*local_f0 + 0x10))();
          local_118 = 0;
          while( true ) {
            plVar14 = (long *)(**(code **)(*local_f0 + 0x18))();
            if (plVar13 == plVar14) {
              bVar10 = 0;
            }
            else {
              bVar10 = (**(code **)(*plVar13 + 0x30))(plVar13,plVar14);
              bVar10 = bVar10 ^ 1;
            }
            if (plVar14 != (long *)0x0) {
              (**(code **)(*plVar14 + 8))(plVar14);
            }
            if (bVar10 == 0) break;
            Message::Message((Message *)&local_1b0);
            puVar15 = (undefined8 *)(**(code **)(*plVar13 + 0x28))(plVar13);
            local_168.field_2._M_allocated_capacity = puVar15[2];
            local_168._M_dataplus._M_p = (pointer)*puVar15;
            local_168._M_string_length = puVar15[1];
            local_168.field_2._8_8_ = local_118;
            (*local_d0)(&local_188,
                        (TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
                         *)&local_168);
            _Var9._M_p = local_188._M_dataplus._M_p;
            if (local_188._M_string_length == 0) {
              bVar11 = false;
            }
            else {
              lVar21 = local_188._M_string_length - 1;
              lVar23 = 0;
              do {
                uVar22 = (uint)(byte)_Var9._M_p[lVar23];
                iVar12 = isalnum(uVar22);
                bVar11 = iVar12 != 0 || uVar22 == 0x5f;
                if (iVar12 == 0 && uVar22 != 0x5f) break;
                bVar25 = lVar21 != lVar23;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            bVar11 = IsTrue(bVar11);
            peVar8 = local_190;
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)&local_168,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x246);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                         0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_188._M_dataplus._M_p,
                                   local_188._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' is invalid, in ",0x11);
              pcVar2 = local_1a0;
              if (local_1a0 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar17 = strlen(local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar2,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," line ",6);
              plVar14 = (long *)std::ostream::operator<<(poVar16,local_1b4);
              std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
              std::ostream::put((char)plVar14);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)&local_168);
            }
            cVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_148,&local_188);
            bVar11 = IsTrue((_Rb_tree_header *)cVar18._M_node ==
                            &local_148._M_impl.super__Rb_tree_header);
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)&local_168,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x24a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_188._M_dataplus._M_p,
                                   local_188._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\', in ",6);
              pcVar2 = local_1a0;
              if (local_1a0 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar17 = strlen(local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar2,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," line ",6);
              plVar14 = (long *)std::ostream::operator<<(poVar16,local_1b4);
              std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
              std::ostream::put((char)plVar14);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)&local_168);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_148,&local_188);
            sVar3 = (peVar8->test_base_name)._M_string_length;
            if (sVar3 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b0._M_head_impl + 0x10),
                         (peVar8->test_base_name)._M_dataplus._M_p,sVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b0._M_head_impl + 0x10),"/",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0._M_head_impl + 0x10),local_188._M_dataplus._M_p,
                       local_188._M_string_length);
            pcVar2 = local_110;
            Message::GetString_abi_cxx11_(&local_168,(Message *)&local_1b0);
            _Var9._M_p = local_168._M_dataplus._M_p;
            auVar26 = (**(code **)(*plVar13 + 0x28))(plVar13);
            PrintToString<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>>
                      (&local_98,auVar26._0_8_,auVar26._8_8_);
            local_c8 = local_98._M_dataplus._M_p;
            local_c0.file._M_dataplus._M_p = (pointer)&local_c0.file.field_2;
            pcVar4 = (peVar8->code_location).file._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar4,
                       pcVar4 + (peVar8->code_location).file._M_string_length);
            local_c0.line = (peVar8->code_location).line;
            iVar12 = (*(local_1a8->super_ParameterizedTestSuiteInfoBase).
                       _vptr_ParameterizedTestSuiteInfoBase[3])();
            bVar11 = IsTrue(true);
            if (!bVar11) {
              GTestLog::GTestLog(&local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x20e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                         ,0x6a);
              pcVar7 = local_1a0;
              if (local_1a0 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar17 = strlen(local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,local_1b4);
              GTestLog::~GTestLog(&local_1b8);
            }
            bVar11 = IsTrue(true);
            if (!bVar11) {
              GTestLog::GTestLog(&local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x223);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                         ,0x6f);
              pcVar7 = local_1a0;
              if (local_1a0 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar17 = strlen(local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,local_1b4);
              GTestLog::~GTestLog(&local_1b8);
            }
            _Var5.
            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_*,_false>
            ._M_head_impl =
                 (local_190->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_*,_false>
            ;
            puVar19 = (undefined4 *)(**(code **)(*plVar13 + 0x28))(plVar13);
            local_68 = *(undefined8 *)(puVar19 + 4);
            local_78 = *puVar19;
            uStack_74 = puVar19[1];
            uStack_70 = puVar19[2];
            uStack_6c = puVar19[3];
            factory = (TestFactoryBase *)
                      (**(code **)(*(long *)_Var5.
                                            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_*,_false>
                                            ._M_head_impl + 0x10))
                                (_Var5.
                                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>_*,_false>
                                 ._M_head_impl,&local_78);
            MakeAndRegisterTestInfo
                      (pcVar2,_Var9._M_p,(char *)0x0,local_c8,&local_c0,
                       (TypeId)CONCAT44(extraout_var,iVar12),(SetUpTestSuiteFunc)0x0,
                       (TearDownTestSuiteFunc)0x0,factory);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.file._M_dataplus._M_p != &local_c0.file.field_2) {
              operator_delete(local_c0.file._M_dataplus._M_p);
            }
            this_00 = local_198;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p);
            }
            if (local_1b0._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
            }
            (**(code **)(*plVar13 + 0x18))(plVar13);
            local_118 = local_118 + 1;
            bVar11 = true;
          }
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 8))(plVar13);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_148);
          if (local_110 != local_100) {
            operator_delete(local_110);
          }
          pIVar24 = local_d8;
          if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
          }
          pIVar24 = pIVar24 + 1;
        } while (pIVar24 !=
                 (local_1a8->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar20 = local_e0 + 1;
    } while (psVar20 !=
             (local_1a8->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar11) {
      return;
    }
  }
  pPVar6 = local_1a8;
  iVar12 = (*(local_1a8->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
             [2])(local_1a8);
  paVar1 = &local_58.file.field_2;
  pcVar4 = (pPVar6->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar4,pcVar4 + (pPVar6->code_location_).file._M_string_length);
  local_58.line = (pPVar6->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar12),&local_58,
             (pPVar6->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pPVar6->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MotionVectorTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }